

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O0

void __thiscall UDMFParser::AddUserKey(UDMFParser *this,FName *key,int kind,int index)

{
  double val;
  int iVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  TArray<FUDMFKey,_FUDMFKey> *this_00;
  FUDMFKey *pFVar5;
  undefined1 local_50 [8];
  FUDMFKey ukey;
  uint i;
  FUDMFKeys *keyarray;
  int index_local;
  int kind_local;
  FName *key_local;
  UDMFParser *this_local;
  
  this_00 = &TMap<int,_FUDMFKeys,_THashTraits<int>,_TValueTraits<FUDMFKeys>_>::operator[]
                       (UDMFKeys + kind,index)->super_TArray<FUDMFKey,_FUDMFKey>;
  for (ukey.StringVal.Chars._4_4_ = 0; uVar2 = ukey.StringVal.Chars._4_4_,
      uVar4 = TArray<FUDMFKey,_FUDMFKey>::Size(this_00), uVar2 < uVar4;
      ukey.StringVal.Chars._4_4_ = ukey.StringVal.Chars._4_4_ + 1) {
    pFVar5 = TArray<FUDMFKey,_FUDMFKey>::operator[](this_00,(ulong)ukey.StringVal.Chars._4_4_);
    bVar3 = FName::operator==(&pFVar5->Key,key);
    if (bVar3) {
      iVar1 = (this->super_UDMFParserBase).sc.TokenType;
      if (iVar1 != 0x102) {
        if (iVar1 == 0x104) {
          iVar1 = (this->super_UDMFParserBase).sc.Number;
          pFVar5 = TArray<FUDMFKey,_FUDMFKey>::operator[](this_00,(ulong)ukey.StringVal.Chars._4_4_)
          ;
          FUDMFKey::operator=(pFVar5,iVar1);
          return;
        }
        if (iVar1 == 0x106) {
          val = (this->super_UDMFParserBase).sc.Float;
          pFVar5 = TArray<FUDMFKey,_FUDMFKey>::operator[](this_00,(ulong)ukey.StringVal.Chars._4_4_)
          ;
          FUDMFKey::operator=(pFVar5,val);
          return;
        }
        if (iVar1 == 0x14b) {
          pFVar5 = TArray<FUDMFKey,_FUDMFKey>::operator[](this_00,(ulong)ukey.StringVal.Chars._4_4_)
          ;
          FUDMFKey::operator=(pFVar5,1);
          return;
        }
        if (iVar1 == 0x14c) {
          pFVar5 = TArray<FUDMFKey,_FUDMFKey>::operator[](this_00,(ulong)ukey.StringVal.Chars._4_4_)
          ;
          FUDMFKey::operator=(pFVar5,0);
          return;
        }
      }
      pFVar5 = TArray<FUDMFKey,_FUDMFKey>::operator[](this_00,(ulong)ukey.StringVal.Chars._4_4_);
      FUDMFKey::operator=(pFVar5,&(this->super_UDMFParserBase).parsedString);
      return;
    }
  }
  FUDMFKey::FUDMFKey((FUDMFKey *)local_50);
  FName::operator=((FName *)local_50,key);
  iVar1 = (this->super_UDMFParserBase).sc.TokenType;
  if (iVar1 != 0x102) {
    if (iVar1 == 0x104) {
      FUDMFKey::operator=((FUDMFKey *)local_50,(this->super_UDMFParserBase).sc.Number);
      goto LAB_006e5da9;
    }
    if (iVar1 == 0x106) {
      FUDMFKey::operator=((FUDMFKey *)local_50,(this->super_UDMFParserBase).sc.Float);
      goto LAB_006e5da9;
    }
    if (iVar1 == 0x14b) {
      FUDMFKey::operator=((FUDMFKey *)local_50,1);
      goto LAB_006e5da9;
    }
    if (iVar1 == 0x14c) {
      FUDMFKey::operator=((FUDMFKey *)local_50,0);
      goto LAB_006e5da9;
    }
  }
  FUDMFKey::operator=((FUDMFKey *)local_50,&(this->super_UDMFParserBase).parsedString);
LAB_006e5da9:
  TArray<FUDMFKey,_FUDMFKey>::Push(this_00,(FUDMFKey *)local_50);
  FUDMFKey::~FUDMFKey((FUDMFKey *)local_50);
  return;
}

Assistant:

void AddUserKey(FName key, int kind, int index)
	{
		FUDMFKeys &keyarray = UDMFKeys[kind][index];

		for(unsigned i=0; i < keyarray.Size(); i++)
		{
			if (keyarray[i].Key == key)
			{
				switch (sc.TokenType)
				{
				case TK_IntConst:
					keyarray[i] = sc.Number;
					break;
				case TK_FloatConst:
					keyarray[i] = sc.Float;
					break;
				default:
				case TK_StringConst:
					keyarray[i] = parsedString;
					break;
				case TK_True:
					keyarray[i] = 1;
					break;
				case TK_False:
					keyarray[i] = 0;
					break;
				}
				return;
			}
		}
		FUDMFKey ukey;
		ukey.Key = key;
		switch (sc.TokenType)
		{
		case TK_IntConst:
			ukey = sc.Number;
			break;
		case TK_FloatConst:
			ukey = sc.Float;
			break;
		default:
		case TK_StringConst:
			ukey = parsedString;
			break;
		case TK_True:
			ukey = 1;
			break;
		case TK_False:
			ukey = 0;
			break;
		}
		keyarray.Push(ukey);
	}